

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

bool __thiscall
cfd::core::ScriptElement::ConvertBinaryToNumber(ScriptElement *this,int64_t *int64_value)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  ByteData::GetBytes(&local_38,&this->binary_data_);
  if (((this->type_ - kElementBinary < 2) &&
      (uVar1 = (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start, uVar1 < 6)) &&
     ((local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish[-1] & 0x7f) != 0)) {
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
    }
    else {
      bVar2 = 0;
      uVar5 = 0;
      uVar3 = 0;
      do {
        uVar3 = uVar3 | (ulong)local_38.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar5] << (bVar2 & 0x3f);
        uVar5 = uVar5 + 1;
        bVar2 = bVar2 + 8;
      } while (uVar1 != uVar5);
    }
    if ((char)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] < '\0') {
      uVar3 = -(uVar3 & ~(0x80L << ((char)((int)uVar1 << 3) - 8U & 0x3f)));
    }
    bVar4 = true;
    if (int64_value != (int64_t *)0x0) {
      *int64_value = uVar3;
    }
  }
  else {
    bVar4 = false;
  }
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool ScriptElement::ConvertBinaryToNumber(int64_t* int64_value) const {
  bool is_success = false;
  std::vector<uint8_t> vch = binary_data_.GetBytes();
  if (((type_ == kElementBinary) || (type_ == kElementNumber)) &&
      (vch.size() <= 5) && ((vch.back() & 0x7f) != 0)) {
    int64_t val = 0;
    for (size_t i = 0; i != vch.size(); ++i) {
      val |= static_cast<int64_t>(vch[i]) << 8 * i;
    }

    if (vch.back() & 0x80) {
      val = -((int64_t)(val & ~(0x80ULL << (8 * (vch.size() - 1)))));
    }
    is_success = true;
    if (int64_value != nullptr) {
      *int64_value = val;
    }
  }
  return is_success;
}